

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::clearBufferiv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,int *value)

{
  bool bVar1;
  ChannelOrder CVar2;
  ChannelOrder CVar3;
  int iVar4;
  ConstPixelBufferAccess *pCVar5;
  InternalError *this_00;
  byte bVar6;
  int iVar7;
  ConstPixelBufferAccess *pCVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ConstPixelBufferAccess *pCVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  MultisamplePixelBufferAccess access;
  IVec4 color;
  MultisamplePixelBufferAccess colorBuf;
  MultisampleConstPixelBufferAccess local_e0;
  ConstPixelBufferAccess local_b8;
  ConstPixelBufferAccess local_90;
  MultisamplePixelBufferAccess local_68;
  
  if ((buffer & 0xfffffffd) == 0x1800) {
    if (drawbuffer == 0) {
      if (this->m_scissorEnabled == true) {
        iVar16 = (this->m_scissorBox).m_data[3];
        iVar12 = (this->m_scissorBox).m_data[2];
        iVar14 = (this->m_scissorBox).m_data[0];
        iVar15 = (this->m_scissorBox).m_data[1];
      }
      else {
        iVar15 = 0;
        iVar16 = 0x7fffffff;
        iVar12 = 0x7fffffff;
        iVar14 = 0;
      }
      if (buffer == 0x1802) {
        getDrawStencilbuffer((MultisamplePixelBufferAccess *)&local_e0,this);
        rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                  ((MultisampleConstPixelBufferAccess *)&local_90,
                   (MultisamplePixelBufferAccess *)&local_e0);
        iVar10 = 0;
        if (0 < iVar14) {
          iVar10 = iVar14;
        }
        iVar7 = 0;
        if (0 < iVar15) {
          iVar7 = iVar15;
        }
        iVar4 = iVar12 + iVar14;
        if (local_90.m_size.m_data[1] <= iVar12 + iVar14) {
          iVar4 = local_90.m_size.m_data[1];
        }
        iVar12 = iVar16 + iVar15;
        if (local_90.m_size.m_data[2] <= iVar16 + iVar15) {
          iVar12 = local_90.m_size.m_data[2];
        }
        iVar12 = iVar12 - iVar7;
        iVar16 = 0;
        if (0 < iVar12) {
          iVar16 = iVar12;
        }
        if (((0 < iVar4 - iVar10) && (0 < iVar12)) && (this->m_stencil[0].writeMask != 0)) {
          rr::getSubregion(&local_68,(MultisamplePixelBufferAccess *)&local_e0,iVar10,iVar7,
                           iVar4 - iVar10,iVar16);
          tcu::getEffectiveDepthStencilAccess
                    ((PixelBufferAccess *)&local_90,&local_68.m_access,MODE_STENCIL);
          rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&local_90);
          if (0 < local_b8.m_size.m_data[2]) {
            CVar2 = *value;
            iVar16 = 0;
            do {
              if (0 < local_b8.m_size.m_data[1]) {
                iVar12 = 0;
                do {
                  if (0 < local_b8.m_size.m_data[0]) {
                    iVar14 = 0;
                    do {
                      CVar3 = this->m_stencil[0].writeMask;
                      tcu::ConstPixelBufferAccess::getPixelInt
                                (&local_90,(int)&local_b8,iVar14,iVar12);
                      local_90.m_format.order =
                           (CVar2 ^ local_90.m_format.order) & CVar3 ^ local_90.m_format.order;
                      local_90.m_format.type = SNORM_INT8;
                      local_90.m_size.m_data[0] = 0;
                      local_90.m_size.m_data[1] = 0;
                      tcu::PixelBufferAccess::setPixel
                                ((PixelBufferAccess *)&local_b8,(IVec4 *)&local_90,iVar14,iVar12,
                                 iVar16);
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < local_b8.m_size.m_data[0]);
                  }
                  iVar12 = iVar12 + 1;
                } while (iVar12 < local_b8.m_size.m_data[1]);
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < local_b8.m_size.m_data[2]);
          }
        }
      }
      else {
        if (buffer != 0x1800) {
          this_00 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_00,(char *)0x0,"buffer == GL_STENCIL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                     ,0xd78);
          __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        getDrawColorbuffer((MultisamplePixelBufferAccess *)&local_90,this);
        bVar1 = (this->m_colorMask).m_data[0];
        bVar6 = 1;
        if (((bVar1 == true) && ((this->m_colorMask).m_data[1] == true)) &&
           ((this->m_colorMask).m_data[2] == true)) {
          bVar6 = (this->m_colorMask).m_data[3] ^ 1;
        }
        bVar9 = 0;
        if (bVar1 == false) {
          if (((this->m_colorMask).m_data[1] == false) && ((this->m_colorMask).m_data[2] == false))
          {
            bVar9 = (this->m_colorMask).m_data[3] ^ 1;
          }
          else {
            bVar9 = 0;
          }
        }
        rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                  (&local_e0,(MultisamplePixelBufferAccess *)&local_90);
        iVar10 = 0;
        if (0 < iVar14) {
          iVar10 = iVar14;
        }
        iVar7 = 0;
        if (0 < iVar15) {
          iVar7 = iVar15;
        }
        iVar4 = iVar12 + iVar14;
        if (local_e0.m_access.m_size.m_data[1] <= iVar12 + iVar14) {
          iVar4 = local_e0.m_access.m_size.m_data[1];
        }
        iVar12 = iVar16 + iVar15;
        if (local_e0.m_access.m_size.m_data[2] <= iVar16 + iVar15) {
          iVar12 = local_e0.m_access.m_size.m_data[2];
        }
        if (((0 < iVar4 - iVar10) && (0 < iVar12 - iVar7)) && (bVar9 == 0)) {
          rr::getSubregion((MultisamplePixelBufferAccess *)&local_e0,
                           (MultisamplePixelBufferAccess *)&local_90,iVar10,iVar7,iVar4 - iVar10,
                           iVar12 - iVar7);
          local_b8.m_format.order = value[0];
          local_b8.m_format.type = value[1];
          local_b8.m_size.m_data._0_8_ = *(undefined8 *)(value + 2);
          if (bVar6 == 0) {
            rr::clear((MultisamplePixelBufferAccess *)&local_e0,(IVec4 *)&local_b8);
          }
          else if (0 < local_e0.m_access.m_size.m_data[2]) {
            iVar16 = 0;
            do {
              if (0 < local_e0.m_access.m_size.m_data[1]) {
                iVar12 = 0;
                do {
                  if (0 < local_e0.m_access.m_size.m_data[0]) {
                    iVar14 = 0;
                    do {
                      tcu::ConstPixelBufferAccess::getPixelInt
                                ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_e0,
                                 iVar14,iVar12);
                      local_68.m_access.super_ConstPixelBufferAccess.m_format.order = R;
                      local_68.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
                      local_68.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
                      local_68.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
                      pCVar5 = &local_b8;
                      lVar11 = 0;
                      pCVar8 = (ConstPixelBufferAccess *)&stack0xffffffffffffffc0;
                      do {
                        pCVar13 = pCVar8;
                        if ((this->m_colorMask).m_data[lVar11] != false) {
                          pCVar13 = pCVar5;
                        }
                        local_68.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2] =
                             (pCVar13->m_format).order;
                        lVar11 = lVar11 + 1;
                        pCVar8 = (ConstPixelBufferAccess *)&(pCVar8->m_format).type;
                        pCVar5 = (ConstPixelBufferAccess *)&(pCVar5->m_format).type;
                      } while (lVar11 != 4);
                      tcu::PixelBufferAccess::setPixel
                                ((PixelBufferAccess *)&local_e0,(IVec4 *)&local_68,iVar14,iVar12,
                                 iVar16);
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < local_e0.m_access.m_size.m_data[0]);
                  }
                  iVar12 = iVar12 + 1;
                } while (iVar12 < local_e0.m_access.m_size.m_data[1]);
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < local_e0.m_access.m_size.m_data[2]);
          }
        }
      }
    }
    else if (this->m_lastError == 0) {
      this->m_lastError = 0x501;
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferiv (deUint32 buffer, int drawbuffer, const int* value)
{
	RC_IF_ERROR(buffer != GL_COLOR && buffer != GL_STENCIL, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	if (buffer == GL_COLOR)
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			IVec4								color		(value[0], value[1], value[2], value[3]);

			if (!maskUsed)
				rr::clear(access, color);
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixelInt(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
	else
	{
		TCU_CHECK_INTERNAL(buffer == GL_STENCIL);

		rr::MultisamplePixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
		IVec4								area		= intersect(baseArea, getBufferRect(stencilBuf));

		if (!isEmpty(area) && m_stencil[rr::FACETYPE_FRONT].writeMask != 0)
		{
			rr::MultisamplePixelBufferAccess	access		= getStencilMultisampleAccess(rr::getSubregion(stencilBuf, area.x(), area.y(), area.z(), area.w()));
			int									stencil		= value[0];

			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						writeMaskedStencil(access, s, x, y, stencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
	}
}